

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 *puVar1;
  size_type sVar2;
  bool bVar3;
  pair<const_int,_int> pVar4;
  pointer *__ptr;
  int i;
  int index;
  char *pcVar5;
  char *in_R9;
  pair<unsigned_long,_unsigned_long> pVar6;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  StringIO stringio;
  string stringbuf;
  TypeParam ht_in;
  TypeParam ht_out;
  pair<const_int,_int> local_198;
  int local_190;
  undefined1 local_188 [8];
  undefined8 local_180;
  AssertHelper local_178;
  string local_170;
  value_type *local_150;
  undefined1 local_148 [8];
  undefined8 local_140;
  undefined1 local_138 [16];
  undefined1 local_128 [8];
  undefined1 local_120 [112];
  pointer local_b0;
  BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_a8;
  
  local_148._0_4_ = 0;
  local_148._4_4_ = 0;
  local_140 = local_140 & 0xffffffff00000000;
  local_170._M_dataplus._M_p = (pointer)0x0;
  local_170._M_string_length = local_170._M_string_length & 0xffffffff00000000;
  local_128 = (undefined1  [8])((ulong)local_128 & 0xffffffff00000000);
  local_120._0_8_ = (pointer)0x0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)&local_a8,0,(hasher *)local_148,(key_equal *)&local_170,(allocator_type *)local_128)
  ;
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(2000);
  this_00 = &local_a8.ht_;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::squash_deleted(&this_00->rep);
  local_a8.ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_
       = true;
  local_a8.ht_.rep.key_info.delkey = pVar4.first;
  index = 1;
  do {
    local_148 = (undefined1  [8])UniqueObjectHelper<std::pair<int_const,int>>(index);
    google::
    BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert((pair<google::BaseHashtableInterface<google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>::iterator,_bool>
              *)local_128,&local_a8,(value_type *)local_148);
    index = index + 1;
  } while (index != 100);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x38);
  local_128._0_4_ = pVar4.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_128);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x16);
  local_128._0_4_ = pVar4.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::erase(&this_00->rep,(key_type *)local_128);
  local_140 = 0;
  local_138[0] = 0;
  local_150 = (value_type *)local_148;
  local_148 = (undefined1  [8])local_138;
  bVar3 = google::
          dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::
          serialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                    ((dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)this_00);
  local_170._M_dataplus._M_p._0_1_ = bVar3;
  local_170._M_string_length = 0;
  if (!bVar3) {
    testing::Message::Message((Message *)local_188);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_170,
               (AssertionResult *)
               "ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x50a,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if (local_128 != (undefined1  [8])(local_120 + 8)) {
      operator_delete((void *)local_128);
    }
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_188 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_188 + 8))();
    }
  }
  sVar2 = local_170._M_string_length;
  if ((undefined8 *)local_170._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_170._M_string_length !=
        (undefined8 *)(local_170._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_170._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  local_188 = (undefined1  [8])0x0;
  local_180 = (undefined8 *)((ulong)local_180._4_4_ << 0x20);
  local_198.first = 0;
  local_198.second = 0;
  local_190 = 0;
  local_170._M_dataplus._M_p = local_170._M_dataplus._M_p & 0xffffffff00000000;
  local_170._M_string_length = 0;
  google::
  HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashMap
            ((HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)local_128,0,(hasher *)local_188,(key_equal *)&local_198,(allocator_type *)&local_170
            );
  bVar3 = google::
          dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
          ::
          unserialize<google::sparsehash_internal::pod_serializer<std::pair<int_const,int>>,StringIO>
                    ((dense_hashtable<std::pair<int_const,int>,int,Hasher,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SelectKey,google::dense_hash_map<int,int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                      *)local_120,&local_150);
  local_188[0] = (internal)bVar3;
  local_180 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_188,
               (AssertionResult *)
               "ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x50e,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_198 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  local_198 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(1);
  local_178.data_._0_4_ = pVar4.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_170,
              (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_178);
  local_170.field_2._8_8_ =
       (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_128;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_188,"this->UniqueObject(1)","*ht_in.find(this->UniqueKey(1))",
             &local_198,(pair<const_int,_int> *)local_170._M_string_length);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (local_180 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x510,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  local_198 = UniqueObjectHelper<std::pair<int_const,int>>(99);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(99);
  local_178.data_._0_4_ = pVar4.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_170,
              (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_178);
  local_170.field_2._8_8_ =
       (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_128;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_188,"this->UniqueObject(99)","*ht_in.find(this->UniqueKey(99))",
             &local_198,(pair<const_int,_int> *)local_170._M_string_length);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (local_180 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x511,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(100);
  local_170._M_dataplus._M_p._0_4_ = pVar4.first;
  pVar6 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_170);
  bVar3 = pVar6.first == 0xffffffffffffffff;
  local_188[0] = (internal)bVar3;
  local_180 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_188,
               (AssertionResult *)"ht_in.count(this->UniqueKey(100))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x512,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_198 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  local_198 = UniqueObjectHelper<std::pair<int_const,int>>(0x15);
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x15);
  local_178.data_._0_4_ = pVar4.first;
  google::
  dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::find<int>((iterator *)&local_170,
              (dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)local_120,(int *)&local_178);
  local_170.field_2._8_8_ =
       (HashtableInterface_DenseHashMap<int,_int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)local_128;
  testing::internal::CmpHelperEQ<std::pair<int_const,int>,std::pair<int_const,int>>
            ((internal *)local_188,"this->UniqueObject(21)","*ht_in.find(this->UniqueKey(21))",
             &local_198,(pair<const_int,_int> *)local_170._M_string_length);
  if (local_188[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_170);
    if (local_180 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_180;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x513,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_198,(Message *)&local_170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_198);
    if ((long *)local_170._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_170._M_dataplus._M_p + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x16);
  local_170._M_dataplus._M_p._0_4_ = pVar4.first;
  pVar6 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_170);
  bVar3 = pVar6.first == 0xffffffffffffffff;
  local_188[0] = (internal)bVar3;
  local_180 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_188,
               (AssertionResult *)"ht_in.count(this->UniqueKey(22))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x515,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_198 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  pVar4 = UniqueObjectHelper<std::pair<int_const,int>>(0x38);
  local_170._M_dataplus._M_p._0_4_ = pVar4.first;
  pVar6 = google::
          dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::find_position<int>
                    ((dense_hashtable<std::pair<const_int,_int>,_int,_Hasher,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<int,_int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)local_120,(int *)&local_170);
  bVar3 = pVar6.first == 0xffffffffffffffff;
  local_188[0] = (internal)bVar3;
  local_180 = (undefined8 *)0x0;
  if (!bVar3) {
    testing::Message::Message((Message *)&local_198);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_170,(internal *)local_188,
               (AssertionResult *)"ht_in.count(this->UniqueKey(56))","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x516,local_170._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_198);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    if (local_198 != (pair<const_int,_int>)0x0) {
      (**(code **)(*(long *)local_198 + 8))();
    }
  }
  puVar1 = local_180;
  if (local_180 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_180 != local_180 + 2) {
      operator_delete((undefined8 *)*local_180);
    }
    operator_delete(puVar1);
  }
  local_128 = (undefined1  [8])&PTR__BaseHashtableInterface_00c233e8;
  if (local_b0 != (pointer)0x0) {
    free(local_b0);
  }
  if (local_148 != (undefined1  [8])local_138) {
    operator_delete((void *)local_148);
  }
  local_a8._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c233e8;
  if (local_a8.ht_.rep.table != (pointer)0x0) {
    free(local_a8.ht_.rep.table);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToString) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  string stringbuf;
  StringIO stringio(&stringbuf);
  EXPECT_TRUE(
      ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));

  TypeParam ht_in;
  EXPECT_TRUE(
      ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}